

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

uint gpu::deviceTypeMin<unsigned_int>(void)

{
  Type TVar1;
  uint32_t uVar2;
  gpu_exception *this;
  undefined1 local_20 [8];
  Context context;
  
  Context::Context((Context *)local_20);
  TVar1 = Context::type((Context *)local_20);
  if (TVar1 == TypeOpenCL) {
    uVar2 = ocl::OpenCLType<unsigned_int>::min();
    Context::~Context((Context *)local_20);
    return uVar2;
  }
  this = (gpu_exception *)__cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception(this,"No GPU active context!");
  __cxa_throw(this,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
}

Assistant:

T gpu::deviceTypeMin() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return std::numeric_limits<T>::min();
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return ocl::OpenCLType<T>::min();
	} else {
		throw gpu_exception("No GPU active context!");
	}
}